

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_object_detector.c
# Opt level: O3

int is_mach_o_magic(elf_header *h,uint *endian,uint *offsetsize)

{
  long lVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  
  uVar2 = (ulong)h->e_ident[0];
  lVar1 = 1;
  do {
    uVar2 = (ulong)h->e_ident[lVar1] | uVar2 << 8;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  uVar3 = 0x20;
  if ((long)uVar2 < 0xfeedface) {
    uVar3 = 0x20;
    if (uVar2 != 0xcefaedfe) {
      if (uVar2 != 0xcffaedfe) {
        return 0;
      }
      uVar3 = 0x40;
    }
    uVar4 = 2;
  }
  else {
    uVar4 = 1;
    if (uVar2 != 0xfeedface) {
      if (uVar2 != 0xfeedfacf) {
        return 0;
      }
      uVar3 = 0x40;
    }
  }
  *endian = uVar4;
  *offsetsize = uVar3;
  return 1;
}

Assistant:

static int
is_mach_o_magic(struct elf_header *h,
    unsigned *endian,
    unsigned *offsetsize)
{
    unsigned long magicval = 0;
    unsigned locendian = 0;
    unsigned locoffsetsize = 0;

    /*  No swapping here. Need to match size of
        Mach-o magic field. */
    magicval = magic_copy(h->e_ident,4);
    if (magicval == MH_MAGIC) {
        locendian = DW_END_big;
        locoffsetsize = 32;
    } else if (magicval == MH_CIGAM) {
        locendian = DW_END_little;
        locoffsetsize = 32;
    }else if (magicval == MH_MAGIC_64) {
        locendian = DW_END_big;
        locoffsetsize = 64;
    } else if (magicval == MH_CIGAM_64) {
        locendian = DW_END_little;
        locoffsetsize = 64;
    } else {
        return FALSE;
    }
    *endian = locendian;
    *offsetsize = locoffsetsize;
    return TRUE;
}